

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_ip_hash_module.c
# Opt level: O2

ngx_int_t ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc,void *data)

{
  ulong *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  byte bVar4;
  ngx_int_t nVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  
  if ((pc->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pc->log,0,"get ip hash peer, try: %ui");
  }
  lVar8 = *(long *)((long)data + 8);
  if (*(long *)(lVar8 + 8) != 0) {
    ngx_rwlock_wlock((ngx_atomic_t *)(lVar8 + 0x10));
    lVar8 = *(long *)((long)data + 8);
  }
  if ((*(byte *)((long)data + 0x40) < 0x15) && ((*(byte *)(lVar8 + 0x28) & 1) == 0)) {
    lVar8 = ngx_cached_time->sec;
    pc->field_0x68 = pc->field_0x68 & 0xfe;
    pc->connection = (ngx_connection_t *)0x0;
    uVar6 = *(ulong *)((long)data + 0x28);
    do {
      for (uVar7 = 0; *(byte *)((long)data + 0x30) != uVar7; uVar7 = uVar7 + 1) {
        uVar6 = ((ulong)*(byte *)(*(long *)((long)data + 0x38) + uVar7) + uVar6 * 0x71) % 0x187f;
      }
      plVar10 = (long *)(*(long *)((long)data + 8) + 0x40);
      uVar9 = 0;
      uVar7 = uVar6 % *(ulong *)(*(long *)((long)data + 8) + 0x20);
      while( true ) {
        puVar2 = (undefined8 *)*plVar10;
        if ((long)uVar7 < (long)puVar2[8]) break;
        plVar10 = puVar2 + 0x14;
        uVar9 = uVar9 + 1;
        uVar7 = uVar7 - puVar2[8];
      }
      uVar7 = 1L << ((byte)uVar9 & 0x3f);
      if ((*(ulong *)(*(long *)((long)data + 0x18) + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) == 0)
      {
        if ((pc->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pc->log,0,"get ip hash peer, hash: %ui %04XL",uVar9,uVar7);
        }
        if (((puVar2[0x12] == 0) &&
            (((puVar2[0xe] == 0 || ((ulong)puVar2[0xb] < (ulong)puVar2[0xe])) ||
             ((long)puVar2[0xf] < lVar8 - puVar2[0xd])))) &&
           (uVar3 = puVar2[9], uVar3 <= puVar2[10] - 1)) {
          *(undefined8 **)((long)data + 0x10) = puVar2;
          pc->sockaddr = (sockaddr *)*puVar2;
          pc->socklen = *(socklen_t *)(puVar2 + 1);
          pc->name = (ngx_str_t *)(puVar2 + 2);
          puVar2[9] = uVar3 + 1;
          if ((long)puVar2[0xf] < lVar8 - puVar2[0xd]) {
            puVar2[0xd] = lVar8;
          }
          if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
            ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
          }
          puVar1 = (ulong *)(*(long *)((long)data + 0x18) + (uVar9 >> 6) * 8);
          *puVar1 = *puVar1 | uVar7;
          *(ulong *)((long)data + 0x28) = uVar6;
          return 0;
        }
      }
      bVar4 = *(char *)((long)data + 0x40) + 1;
      *(byte *)((long)data + 0x40) = bVar4;
    } while (bVar4 < 0x15);
    lVar8 = *(long *)((long)data + 8);
  }
  if (*(long *)(lVar8 + 8) != 0) {
    ngx_rwlock_unlock((ngx_atomic_t *)(lVar8 + 0x10));
  }
  nVar5 = (**(code **)((long)data + 0x48))(pc,data);
  return nVar5;
}

Assistant:

static ngx_int_t
ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc, void *data)
{
    ngx_http_upstream_ip_hash_peer_data_t  *iphp = data;

    time_t                        now;
    ngx_int_t                     w;
    uintptr_t                     m;
    ngx_uint_t                    i, n, p, hash;
    ngx_http_upstream_rr_peer_t  *peer;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "get ip hash peer, try: %ui", pc->tries);

    /* TODO: cached */

    ngx_http_upstream_rr_peers_wlock(iphp->rrp.peers);

    if (iphp->tries > 20 || iphp->rrp.peers->single) {
        ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
        return iphp->get_rr_peer(pc, &iphp->rrp);
    }

    now = ngx_time();

    pc->cached = 0;
    pc->connection = NULL;

    hash = iphp->hash;

    for ( ;; ) {

        for (i = 0; i < (ngx_uint_t) iphp->addrlen; i++) {
            hash = (hash * 113 + iphp->addr[i]) % 6271;
        }

        w = hash % iphp->rrp.peers->total_weight;
        peer = iphp->rrp.peers->peer;
        p = 0;

        while (w >= peer->weight) {
            w -= peer->weight;
            peer = peer->next;
            p++;
        }

        n = p / (8 * sizeof(uintptr_t));
        m = (uintptr_t) 1 << p % (8 * sizeof(uintptr_t));

        if (iphp->rrp.tried[n] & m) {
            goto next;
        }

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                       "get ip hash peer, hash: %ui %04XL", p, (uint64_t) m);

        if (peer->down) {
            goto next;
        }

        if (peer->max_fails
            && peer->fails >= peer->max_fails
            && now - peer->checked <= peer->fail_timeout)
        {
            goto next;
        }

        if (peer->max_conns && peer->conns >= peer->max_conns) {
            goto next;
        }

        break;

    next:

        if (++iphp->tries > 20) {
            ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
            return iphp->get_rr_peer(pc, &iphp->rrp);
        }
    }

    iphp->rrp.current = peer;

    pc->sockaddr = peer->sockaddr;
    pc->socklen = peer->socklen;
    pc->name = &peer->name;

    peer->conns++;

    if (now - peer->checked > peer->fail_timeout) {
        peer->checked = now;
    }

    ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);

    iphp->rrp.tried[n] |= m;
    iphp->hash = hash;

    return NGX_OK;
}